

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt tt_cmap6_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  
  pFVar1 = cmap->data;
  uVar3 = char_code - (ushort)(*(ushort *)(pFVar1 + 6) << 8 | *(ushort *)(pFVar1 + 6) >> 8);
  uVar2 = 0;
  if (uVar3 < (ushort)(*(ushort *)(pFVar1 + 8) << 8 | *(ushort *)(pFVar1 + 8) >> 8)) {
    uVar2 = (uint)(ushort)(*(ushort *)(pFVar1 + (ulong)uVar3 * 2 + 10) << 8 |
                          *(ushort *)(pFVar1 + (ulong)uVar3 * 2 + 10) >> 8);
  }
  return uVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap6_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    FT_Byte*  table  = cmap->data;
    FT_UInt   result = 0;
    FT_Byte*  p      = table + 6;
    FT_UInt   start  = TT_NEXT_USHORT( p );
    FT_UInt   count  = TT_NEXT_USHORT( p );
    FT_UInt   idx    = (FT_UInt)( char_code - start );


    if ( idx < count )
    {
      p += 2 * idx;
      result = TT_PEEK_USHORT( p );
    }

    return result;
  }